

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

SnapShot * __thiscall
TTD::EventLog::DoSnapshotExtract_Helper
          (EventLog *this,double gcTime,
          BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *liveTopLevelBodies)

{
  SnapshotExtractor *this_00;
  SnapShot *pSVar1;
  
  this_00 = &this->m_snapExtractor;
  SnapshotExtractor::BeginSnapshot(this_00,this->m_threadContext,gcTime);
  SnapshotExtractor::DoMarkWalk(this_00,this->m_threadContext);
  SnapshotExtractor::EvacuateMarkedIntoSnapshot(this_00,this->m_threadContext,liveTopLevelBodies);
  pSVar1 = SnapshotExtractor::CompleteSnapshot(this_00);
  return pSVar1;
}

Assistant:

SnapShot* EventLog::DoSnapshotExtract_Helper(double gcTime, JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator>& liveTopLevelBodies)
    {
        SnapShot* snap = nullptr;

        //Begin the actual snapshot operation
        this->m_snapExtractor.BeginSnapshot(this->m_threadContext, gcTime);
        this->m_snapExtractor.DoMarkWalk(this->m_threadContext);

        ///////////////////////////
        //Phase 2: Evacuate marked objects
        //Allows for parallel execute and evacuate (in conjunction with later refactoring)

        this->m_snapExtractor.EvacuateMarkedIntoSnapshot(this->m_threadContext, liveTopLevelBodies);

        ///////////////////////////
        //Phase 3: Complete and return snapshot

        snap = this->m_snapExtractor.CompleteSnapshot();

        return snap;
    }